

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secure.h
# Opt level: O0

array<unsigned_char,_96UL> * __thiscall
secure_allocator<std::array<unsigned_char,_96UL>_>::allocate
          (secure_allocator<std::array<unsigned_char,_96UL>_> *this,size_t n)

{
  long lVar1;
  array<unsigned_char,_96UL> *paVar2;
  undefined8 uVar3;
  long in_FS_OFFSET;
  array<unsigned_char,_96UL> *allocation;
  bad_alloc *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  LockedPoolManager::Instance();
  paVar2 = (array<unsigned_char,_96UL> *)LockedPool::alloc((LockedPool *)this,n);
  if (paVar2 == (array<unsigned_char,_96UL> *)0x0) {
    uVar3 = __cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(in_stack_ffffffffffffffc8);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(uVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return paVar2;
  }
  __stack_chk_fail();
}

Assistant:

T* allocate(std::size_t n)
    {
        T* allocation = static_cast<T*>(LockedPoolManager::Instance().alloc(sizeof(T) * n));
        if (!allocation) {
            throw std::bad_alloc();
        }
        return allocation;
    }